

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

double kj::_::anon_unknown_0::NoLocaleStrtod(char *text,char **original_endptr)

{
  size_t sVar1;
  size_t sVar2;
  char *pcStack_68;
  int size_diff;
  char *localized_endptr;
  char *local_50;
  char *localized_cstr;
  String localized;
  double result;
  char *temp_endptr;
  char **original_endptr_local;
  char *text_local;
  
  temp_endptr = (char *)original_endptr;
  original_endptr_local = (char **)text;
  localized.content.disposer = (ArrayDisposer *)strtod(text,(char **)&result);
  if (temp_endptr != (char *)0x0) {
    *(double *)temp_endptr = result;
  }
  text_local = (char *)localized.content.disposer;
  if (*(char *)result == '.') {
    anon_unknown_8::LocalizeRadix
              ((String *)&localized_cstr,(char *)original_endptr_local,(char *)result);
    local_50 = String::cStr((String *)&localized_cstr);
    localized.content.disposer = (ArrayDisposer *)strtod(local_50,&stack0xffffffffffffff98);
    if (((long)result - (long)original_endptr_local < (long)pcStack_68 - (long)local_50) &&
       (temp_endptr != (char *)0x0)) {
      sVar1 = String::size((String *)&localized_cstr);
      sVar2 = strlen((char *)original_endptr_local);
      *(char **)temp_endptr =
           (char *)((long)original_endptr_local +
                   (long)(pcStack_68 + (-(long)((int)sVar1 - (int)sVar2) - (long)local_50)));
    }
    text_local = (char *)localized.content.disposer;
    String::~String((String *)&localized_cstr);
  }
  return (double)text_local;
}

Assistant:

double NoLocaleStrtod(const char* text, char** original_endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char* temp_endptr;
  double result = strtod(text, &temp_endptr);
  if (original_endptr != NULL) *original_endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  kj::String localized = LocalizeRadix(text, temp_endptr);
  const char* localized_cstr = localized.cStr();
  char* localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) >
      (temp_endptr - text)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update original_endptr to point at the right location.
    if (original_endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(text);
      // const_cast is necessary to match the strtod() interface.
      *original_endptr = const_cast<char*>(
        text + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}